

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O0

size_t HUF_readDTableX1_wksp
                 (HUF_DTable *DTable,void *src,size_t srcSize,void *workSpace,size_t wkspSize,
                 int flags)

{
  int iVar1;
  BYTE nbBits_00;
  uint uVar2;
  DTableDesc DVar3;
  int iVar4;
  HUF_DTable *code;
  ulong uVar5;
  U64 UVar6;
  U32 local_e4;
  U64 D4_2;
  U64 D4_1;
  U64 D4;
  HUF_DEltX1 D_1;
  HUF_DEltX1 D;
  int u_1;
  int s;
  BYTE nbBits;
  int uStart;
  int length;
  int symbolCount;
  int rankStart;
  int symbol;
  U32 w_2;
  size_t w_1;
  size_t w;
  int u;
  U32 curr;
  int nLimit;
  int unroll;
  U32 nextRankStart;
  int n;
  U32 targetTableLog;
  U32 maxTableLog;
  DTableDesc dtd;
  HUF_ReadDTableX1_Workspace *wksp;
  HUF_DEltX1 *dt;
  void *dtPtr;
  size_t iSize;
  U32 local_40;
  U32 nbSymbols;
  U32 tableLog;
  int flags_local;
  size_t wkspSize_local;
  void *workSpace_local;
  size_t srcSize_local;
  void *src_local;
  HUF_DTable *DTable_local;
  
  local_40 = 0;
  iSize._4_4_ = 0;
  if (wkspSize < 0x5d4) {
    DTable_local = (HUF_DTable *)0xffffffffffffffd4;
  }
  else {
    nbSymbols = flags;
    _tableLog = wkspSize;
    wkspSize_local = (size_t)workSpace;
    workSpace_local = (void *)srcSize;
    srcSize_local = (size_t)src;
    src_local = DTable;
    code = (HUF_DTable *)
           HUF_readStats_wksp((BYTE *)((long)workSpace + 0x4d4),0x100,(U32 *)workSpace,
                              (U32 *)((long)&iSize + 4),&local_40,src,srcSize,
                              (void *)((long)workSpace + 0x68),0x36c,flags);
    uVar2 = ERR_isError((size_t)code);
    DTable_local = code;
    if (uVar2 == 0) {
      DVar3 = HUF_getDTableDesc((HUF_DTable *)src_local);
      local_e4 = ((uint)DVar3 & 0xff) + 1;
      if (10 < local_e4) {
        local_e4 = 0xb;
      }
      local_40 = HUF_rescaleStats((BYTE *)((long)workSpace + 0x4d4),(U32 *)workSpace,iSize._4_4_,
                                  local_40,local_e4);
      if (((uint)DVar3 & 0xff) + 1 < local_40) {
        DTable_local = (HUF_DTable *)0xffffffffffffffd4;
      }
      else {
        targetTableLog._0_2_ = (ushort)DVar3.maxTableLog;
        targetTableLog._3_1_ = DVar3.reserved;
        targetTableLog._0_3_ = CONCAT12((char)local_40,(ushort)targetTableLog);
        *(U32 *)src_local = targetTableLog;
        nLimit = 0;
        for (unroll = 0; unroll < (int)(local_40 + 1); unroll = unroll + 1) {
          iVar1 = *(int *)((long)workSpace + (long)unroll * 4);
          *(int *)((long)workSpace + (long)unroll * 4 + 0x34) = nLimit;
          nLimit = iVar1 + nLimit;
        }
        for (unroll = 0; unroll < (int)(iSize._4_4_ - 3); unroll = unroll + 4) {
          for (w._4_4_ = 0; w._4_4_ < 4; w._4_4_ = w._4_4_ + 1) {
            uVar5 = (ulong)*(byte *)((long)workSpace + (long)(unroll + w._4_4_) + 0x4d4);
            uVar2 = *(uint *)((long)workSpace + uVar5 * 4 + 0x34);
            *(uint *)((long)workSpace + uVar5 * 4 + 0x34) = uVar2 + 1;
            *(char *)((long)workSpace + (ulong)uVar2 + 0x3d4) = (char)unroll + (char)w._4_4_;
          }
        }
        for (; unroll < (int)iSize._4_4_; unroll = unroll + 1) {
          uVar5 = (ulong)*(byte *)((long)workSpace + (long)unroll + 0x4d4);
          uVar2 = *(uint *)((long)workSpace + uVar5 * 4 + 0x34);
          *(uint *)((long)workSpace + uVar5 * 4 + 0x34) = uVar2 + 1;
          *(char *)((long)workSpace + (ulong)uVar2 + 0x3d4) = (char)unroll;
        }
        symbolCount = *workSpace;
        length = 0;
        for (rankStart = 1; (uint)rankStart < local_40 + 1; rankStart = rankStart + 1) {
          iVar1 = *(int *)((long)workSpace + (ulong)(uint)rankStart * 4);
          iVar4 = (1 << ((byte)rankStart & 0x1f)) >> 1;
          s = length;
          nbBits_00 = ((char)local_40 - (byte)rankStart) + '\x01';
          switch(iVar4) {
          case 1:
            for (_D_1 = 0; _D_1 < iVar1; _D_1 = _D_1 + 1) {
              D4._2_2_ = CONCAT11(*(undefined1 *)
                                   ((long)workSpace + (long)(symbolCount + _D_1) + 0x3d4),nbBits_00)
              ;
              *(undefined2 *)((long)DTable + (long)s * 2 + 4) = D4._2_2_;
              s = s + 1;
            }
            break;
          case 2:
            for (_D_1 = 0; _D_1 < iVar1; _D_1 = _D_1 + 1) {
              D4._0_2_ = CONCAT11(*(undefined1 *)
                                   ((long)workSpace + (long)(symbolCount + _D_1) + 0x3d4),nbBits_00)
              ;
              *(undefined2 *)((long)DTable + (long)s * 2 + 4) = (undefined2)D4;
              *(undefined2 *)((long)DTable + (long)(s + 1) * 2 + 4) = (undefined2)D4;
              s = s + 2;
            }
            break;
          default:
            for (_D_1 = 0; _D_1 < iVar1; _D_1 = _D_1 + 1) {
              UVar6 = HUF_DEltX1_set4(*(BYTE *)((long)workSpace + (long)(symbolCount + _D_1) + 0x3d4
                                               ),nbBits_00);
              for (D4._4_4_ = 0; D4._4_4_ < iVar4; D4._4_4_ = D4._4_4_ + 0x10) {
                MEM_write64((void *)((long)DTable + (long)D4._4_4_ * 2 + (long)s * 2 + 4),UVar6);
                MEM_write64((void *)((long)DTable + (long)D4._4_4_ * 2 + (long)s * 2 + 0xc),UVar6);
                MEM_write64((void *)((long)DTable + (long)D4._4_4_ * 2 + (long)s * 2 + 0x14),UVar6);
                MEM_write64((void *)((long)DTable + (long)D4._4_4_ * 2 + (long)s * 2 + 0x1c),UVar6);
              }
              if (D4._4_4_ != iVar4) {
                __assert_fail("u == length",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                              ,0x1e1,
                              "size_t HUF_readDTableX1_wksp(HUF_DTable *, const void *, size_t, void *, size_t, int)"
                             );
              }
              s = iVar4 + s;
            }
            break;
          case 4:
            for (_D_1 = 0; _D_1 < iVar1; _D_1 = _D_1 + 1) {
              UVar6 = HUF_DEltX1_set4(*(BYTE *)((long)workSpace + (long)(symbolCount + _D_1) + 0x3d4
                                               ),nbBits_00);
              MEM_write64((void *)((long)DTable + (long)s * 2 + 4),UVar6);
              s = s + 4;
            }
            break;
          case 8:
            for (_D_1 = 0; _D_1 < iVar1; _D_1 = _D_1 + 1) {
              UVar6 = HUF_DEltX1_set4(*(BYTE *)((long)workSpace + (long)(symbolCount + _D_1) + 0x3d4
                                               ),nbBits_00);
              MEM_write64((void *)((long)DTable + (long)s * 2 + 4),UVar6);
              MEM_write64((void *)((long)DTable + (long)s * 2 + 0xc),UVar6);
              s = s + 8;
            }
          }
          symbolCount = iVar1 + symbolCount;
          length = iVar1 * iVar4 + length;
        }
      }
    }
  }
  return (size_t)DTable_local;
}

Assistant:

size_t HUF_readDTableX1_wksp(HUF_DTable* DTable, const void* src, size_t srcSize, void* workSpace, size_t wkspSize, int flags)
{
    U32 tableLog = 0;
    U32 nbSymbols = 0;
    size_t iSize;
    void* const dtPtr = DTable + 1;
    HUF_DEltX1* const dt = (HUF_DEltX1*)dtPtr;
    HUF_ReadDTableX1_Workspace* wksp = (HUF_ReadDTableX1_Workspace*)workSpace;

    DEBUG_STATIC_ASSERT(HUF_DECOMPRESS_WORKSPACE_SIZE >= sizeof(*wksp));
    if (sizeof(*wksp) > wkspSize) return ERROR(tableLog_tooLarge);

    DEBUG_STATIC_ASSERT(sizeof(DTableDesc) == sizeof(HUF_DTable));
    /* ZSTD_memset(huffWeight, 0, sizeof(huffWeight)); */   /* is not necessary, even though some analyzer complain ... */

    iSize = HUF_readStats_wksp(wksp->huffWeight, HUF_SYMBOLVALUE_MAX + 1, wksp->rankVal, &nbSymbols, &tableLog, src, srcSize, wksp->statsWksp, sizeof(wksp->statsWksp), flags);
    if (HUF_isError(iSize)) return iSize;


    /* Table header */
    {   DTableDesc dtd = HUF_getDTableDesc(DTable);
        U32 const maxTableLog = dtd.maxTableLog + 1;
        U32 const targetTableLog = MIN(maxTableLog, HUF_DECODER_FAST_TABLELOG);
        tableLog = HUF_rescaleStats(wksp->huffWeight, wksp->rankVal, nbSymbols, tableLog, targetTableLog);
        if (tableLog > (U32)(dtd.maxTableLog+1)) return ERROR(tableLog_tooLarge);   /* DTable too small, Huffman tree cannot fit in */
        dtd.tableType = 0;
        dtd.tableLog = (BYTE)tableLog;
        ZSTD_memcpy(DTable, &dtd, sizeof(dtd));
    }

    /* Compute symbols and rankStart given rankVal:
     *
     * rankVal already contains the number of values of each weight.
     *
     * symbols contains the symbols ordered by weight. First are the rankVal[0]
     * weight 0 symbols, followed by the rankVal[1] weight 1 symbols, and so on.
     * symbols[0] is filled (but unused) to avoid a branch.
     *
     * rankStart contains the offset where each rank belongs in the DTable.
     * rankStart[0] is not filled because there are no entries in the table for
     * weight 0.
     */
    {   int n;
        U32 nextRankStart = 0;
        int const unroll = 4;
        int const nLimit = (int)nbSymbols - unroll + 1;
        for (n=0; n<(int)tableLog+1; n++) {
            U32 const curr = nextRankStart;
            nextRankStart += wksp->rankVal[n];
            wksp->rankStart[n] = curr;
        }
        for (n=0; n < nLimit; n += unroll) {
            int u;
            for (u=0; u < unroll; ++u) {
                size_t const w = wksp->huffWeight[n+u];
                wksp->symbols[wksp->rankStart[w]++] = (BYTE)(n+u);
            }
        }
        for (; n < (int)nbSymbols; ++n) {
            size_t const w = wksp->huffWeight[n];
            wksp->symbols[wksp->rankStart[w]++] = (BYTE)n;
        }
    }

    /* fill DTable
     * We fill all entries of each weight in order.
     * That way length is a constant for each iteration of the outer loop.
     * We can switch based on the length to a different inner loop which is
     * optimized for that particular case.
     */
    {   U32 w;
        int symbol = wksp->rankVal[0];
        int rankStart = 0;
        for (w=1; w<tableLog+1; ++w) {
            int const symbolCount = wksp->rankVal[w];
            int const length = (1 << w) >> 1;
            int uStart = rankStart;
            BYTE const nbBits = (BYTE)(tableLog + 1 - w);
            int s;
            int u;
            switch (length) {
            case 1:
                for (s=0; s<symbolCount; ++s) {
                    HUF_DEltX1 D;
                    D.byte = wksp->symbols[symbol + s];
                    D.nbBits = nbBits;
                    dt[uStart] = D;
                    uStart += 1;
                }
                break;
            case 2:
                for (s=0; s<symbolCount; ++s) {
                    HUF_DEltX1 D;
                    D.byte = wksp->symbols[symbol + s];
                    D.nbBits = nbBits;
                    dt[uStart+0] = D;
                    dt[uStart+1] = D;
                    uStart += 2;
                }
                break;
            case 4:
                for (s=0; s<symbolCount; ++s) {
                    U64 const D4 = HUF_DEltX1_set4(wksp->symbols[symbol + s], nbBits);
                    MEM_write64(dt + uStart, D4);
                    uStart += 4;
                }
                break;
            case 8:
                for (s=0; s<symbolCount; ++s) {
                    U64 const D4 = HUF_DEltX1_set4(wksp->symbols[symbol + s], nbBits);
                    MEM_write64(dt + uStart, D4);
                    MEM_write64(dt + uStart + 4, D4);
                    uStart += 8;
                }
                break;
            default:
                for (s=0; s<symbolCount; ++s) {
                    U64 const D4 = HUF_DEltX1_set4(wksp->symbols[symbol + s], nbBits);
                    for (u=0; u < length; u += 16) {
                        MEM_write64(dt + uStart + u + 0, D4);
                        MEM_write64(dt + uStart + u + 4, D4);
                        MEM_write64(dt + uStart + u + 8, D4);
                        MEM_write64(dt + uStart + u + 12, D4);
                    }
                    assert(u == length);
                    uStart += length;
                }
                break;
            }
            symbol += symbolCount;
            rankStart += symbolCount * length;
        }
    }
    return iSize;
}